

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboDepthbufferTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::DepthTestClampCase::render(DepthTestClampCase *this,Surface *dst)

{
  int width;
  int height;
  Surface *dst_00;
  deUint32 program;
  TransferFormat TVar1;
  Context *pCVar2;
  Vector<float,_4> local_238;
  Vector<float,_4> local_228;
  TextureFormat local_218;
  Vector<float,_3> local_210;
  Vector<float,_3> local_204;
  Vector<float,_3> local_1f8;
  Vector<float,_3> local_1ec;
  undefined1 local_1e0 [8];
  Vec4 green;
  Vec4 yellow;
  float clearDepth;
  undefined1 local_1a8 [4];
  deUint32 depthGradShaderID;
  DepthGradientShader depthGradShader;
  deUint32 local_30;
  deUint32 dStack_2c;
  TransferFormat transferFmt;
  deUint32 depthTexture;
  deUint32 colorRbo;
  deUint32 fbo;
  deUint32 colorFormat;
  Surface *dst_local;
  DepthTestClampCase *this_local;
  
  colorRbo = 0x8058;
  depthTexture = 0;
  transferFmt.dataType = 0;
  transferFmt.format = 0;
  _fbo = dst;
  dst_local = (Surface *)this;
  depthGradShader.u_color = (UniformSlot *)glu::mapGLInternalFormat(this->m_format);
  TVar1 = glu::getTransferFormat((TextureFormat)depthGradShader.u_color);
  FboTestUtil::DepthGradientShader::DepthGradientShader
            ((DepthGradientShader *)local_1a8,TYPE_FLOAT_VEC4);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  program = (*pCVar2->_vptr_Context[0x75])(pCVar2,local_1a8);
  yellow.m_data[2] = 1.0;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(green.m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1e0,0.0,1.0,0.0,1.0);
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,&depthTexture);
  sglr::ContextWrapper::glGenRenderbuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,&transferFmt.dataType);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_FboTestCase).super_ContextWrapper,1,&transferFmt.format);
  sglr::ContextWrapper::glBindRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,transferFmt.dataType);
  sglr::ContextWrapper::glRenderbufferStorage
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,0x8058,this->m_width,
             this->m_height);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,transferFmt.format);
  local_30 = TVar1.format;
  dStack_2c = TVar1.dataType;
  sglr::ContextWrapper::glTexImage2D
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0,this->m_format,this->m_width,
             this->m_height,0,local_30,dStack_2c,(void *)0x0);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2800,0x2600);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboTestCase).super_ContextWrapper,0xde1,0x2801,0x2600);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,depthTexture);
  sglr::ContextWrapper::glFramebufferRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0x8d41,
             transferFmt.dataType);
  sglr::ContextWrapper::glFramebufferTexture2D
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d00,0xde1,transferFmt.format,
             0);
  FboTestCase::checkError(&this->super_FboTestCase);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glViewport
            (&(this->super_FboTestCase).super_ContextWrapper,0,0,this->m_width,this->m_height);
  sglr::ContextWrapper::glClearBufferfv
            (&(this->super_FboTestCase).super_ContextWrapper,0x1801,0,yellow.m_data + 2);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glDepthFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestUtil::DepthGradientShader::setUniforms
            ((DepthGradientShader *)local_1a8,pCVar2,program,-1.0,2.0,(Vec4 *)local_1e0);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  tcu::Vector<float,_3>::Vector(&local_1ec,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_1f8,1.0,1.0,1.0);
  sglr::drawQuad(pCVar2,program,&local_1ec,&local_1f8);
  sglr::ContextWrapper::glDepthFunc(&(this->super_FboTestCase).super_ContextWrapper,0x202);
  pCVar2 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestUtil::DepthGradientShader::setUniforms
            ((DepthGradientShader *)local_1a8,pCVar2,program,-0.5,3.0,(Vec4 *)(green.m_data + 2));
  pCVar2 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  tcu::Vector<float,_3>::Vector(&local_204,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_210,1.0,1.0,1.0);
  sglr::drawQuad(pCVar2,program,&local_204,&local_210);
  dst_00 = _fbo;
  width = this->m_width;
  height = this->m_height;
  local_218 = glu::mapGLInternalFormat(0x8058);
  tcu::Vector<float,_4>::Vector(&local_228,1.0);
  tcu::Vector<float,_4>::Vector(&local_238,0.0);
  FboTestCase::readPixels
            (&this->super_FboTestCase,dst_00,0,0,width,height,&local_218,&local_228,&local_238);
  FboTestUtil::DepthGradientShader::~DepthGradientShader((DepthGradientShader *)local_1a8);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const deUint32			colorFormat			= GL_RGBA8;
		deUint32				fbo					= 0;
		deUint32				colorRbo			= 0;
		deUint32				depthTexture		= 0;
		glu::TransferFormat		transferFmt			= glu::getTransferFormat(glu::mapGLInternalFormat(m_format));

		DepthGradientShader		depthGradShader		(glu::TYPE_FLOAT_VEC4);
		const deUint32			depthGradShaderID	= getCurrentContext()->createProgram(&depthGradShader);
		const float				clearDepth			= 1.0f;
		const tcu::Vec4			yellow				(1.0, 1.0, 0.0, 1.0);
		const tcu::Vec4			green				(0.0, 1.0, 0.0, 1.0);

		// Setup FBO

		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &colorRbo);
		glGenTextures(1, &depthTexture);

		glBindRenderbuffer(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorage(GL_RENDERBUFFER, colorFormat, m_width, m_height);

		glBindTexture(GL_TEXTURE_2D, depthTexture);
		glTexImage2D(GL_TEXTURE_2D, 0, m_format, m_width, m_height, 0, transferFmt.format, transferFmt.dataType, DE_NULL);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, depthTexture, 0);
		checkError();
		checkFramebufferStatus(GL_FRAMEBUFFER);

		glViewport(0, 0, m_width, m_height);

		// Clear depth to 1
		glClearBufferfv(GL_DEPTH, 0, &clearDepth);

		// Test values used in depth test are clamped

		// Render green quad, depth gradient = [-1..2]
		glEnable(GL_DEPTH_TEST);
		glDepthFunc(GL_ALWAYS);

		depthGradShader.setUniforms(*getCurrentContext(), depthGradShaderID, -1.0f, 2.0f, green);
		sglr::drawQuad(*getCurrentContext(), depthGradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		// Render yellow quad, depth gradient = [-0.5..3]. Gradients have equal values only outside [0, 1] range due to clamping
		glDepthFunc(GL_EQUAL);
		depthGradShader.setUniforms(*getCurrentContext(), depthGradShaderID, -0.5f, 3.0f, yellow);
		sglr::drawQuad(*getCurrentContext(), depthGradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		// Read results.
		readPixels(dst, 0, 0, m_width, m_height, glu::mapGLInternalFormat(colorFormat), Vec4(1.0f), Vec4(0.0f));
	}